

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

void hsmooth(int *a,int nxtop,int nytop,int ny,int scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int m2;
  int m1;
  int hy2;
  int hx2;
  int hpp;
  int hmp;
  int hpm;
  int hmm;
  int hp;
  int h0;
  int hm;
  int smax;
  int s;
  int dmin;
  int dmax;
  int diff;
  int s00;
  int s10;
  int ny2;
  int j;
  int i;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  
  iVar3 = in_R8D >> 1;
  if (0 < iVar3) {
    iVar4 = in_ECX * 2;
    for (local_1c = 2; local_1c < in_ESI + -2; local_1c = local_1c + 2) {
      local_2c = in_ECX * local_1c;
      local_28 = local_2c + in_ECX;
      for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 2) {
        iVar1 = *(int *)(in_RDI + (long)(local_2c + in_ECX * -2) * 4);
        iVar2 = *(int *)(in_RDI + (long)local_2c * 4);
        local_80 = *(int *)(in_RDI + (long)(local_2c + iVar4) * 4);
        iVar5 = local_80 - iVar1;
        if (local_80 - iVar2 < iVar2 - iVar1) {
          local_70 = local_80 - iVar2;
        }
        else {
          local_70 = iVar2 - iVar1;
        }
        if (local_70 < 1) {
          local_78 = 0;
        }
        else {
          if (local_80 - iVar2 < iVar2 - iVar1) {
            local_74 = local_80 - iVar2;
          }
          else {
            local_74 = iVar2 - iVar1;
          }
          local_78 = local_74;
        }
        local_8c = local_78 << 2;
        if (iVar2 - iVar1 < local_80 - iVar2) {
          local_7c = local_80 - iVar2;
        }
        else {
          local_7c = iVar2 - iVar1;
        }
        if (local_7c < 0) {
          if (iVar2 - iVar1 < local_80 - iVar2) {
            local_80 = local_80 - iVar2;
          }
          else {
            local_80 = iVar2 - iVar1;
          }
          local_84 = local_80;
        }
        else {
          local_84 = 0;
        }
        local_90 = local_84 << 2;
        if (local_90 < local_8c) {
          local_88 = local_8c;
          if (iVar5 < local_8c) {
            local_88 = iVar5;
          }
          if (local_90 < local_88) {
            if (iVar5 < local_8c) {
              local_8c = iVar5;
            }
            local_90 = local_8c;
          }
          local_90 = local_90 + *(int *)(in_RDI + (long)local_28 * 4) * -8;
          if (local_90 < 0) {
            local_90 = local_90 + 7;
          }
          local_94 = local_90 >> 3;
          local_98 = iVar3;
          if (local_94 < iVar3) {
            local_98 = local_94;
          }
          if (-iVar3 < local_98) {
            local_9c = iVar3;
            if (local_94 < iVar3) {
              local_9c = local_94;
            }
            local_a0 = local_9c;
          }
          else {
            local_a0 = -iVar3;
          }
          *(int *)(in_RDI + (long)local_28 * 4) = *(int *)(in_RDI + (long)local_28 * 4) + local_a0;
        }
        local_2c = local_2c + 2;
        local_28 = local_28 + 2;
      }
    }
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 2) {
      iVar1 = in_ECX * local_1c;
      for (local_20 = 2; local_2c = iVar1 + 2, local_20 < in_EDX + -2; local_20 = local_20 + 2) {
        iVar2 = *(int *)(in_RDI + (long)iVar1 * 4);
        iVar5 = *(int *)(in_RDI + (long)local_2c * 4);
        local_b4 = *(int *)(in_RDI + (long)(iVar1 + 4) * 4);
        iVar6 = local_b4 - iVar2;
        if (local_b4 - iVar5 < iVar5 - iVar2) {
          local_a4 = local_b4 - iVar5;
        }
        else {
          local_a4 = iVar5 - iVar2;
        }
        if (local_a4 < 1) {
          local_ac = 0;
        }
        else {
          if (local_b4 - iVar5 < iVar5 - iVar2) {
            local_a8 = local_b4 - iVar5;
          }
          else {
            local_a8 = iVar5 - iVar2;
          }
          local_ac = local_a8;
        }
        local_c0 = local_ac << 2;
        if (iVar5 - iVar2 < local_b4 - iVar5) {
          local_b0 = local_b4 - iVar5;
        }
        else {
          local_b0 = iVar5 - iVar2;
        }
        if (local_b0 < 0) {
          if (iVar5 - iVar2 < local_b4 - iVar5) {
            local_b4 = local_b4 - iVar5;
          }
          else {
            local_b4 = iVar5 - iVar2;
          }
          local_b8 = local_b4;
        }
        else {
          local_b8 = 0;
        }
        local_c4 = local_b8 << 2;
        if (local_c4 < local_c0) {
          local_bc = local_c0;
          if (iVar6 < local_c0) {
            local_bc = iVar6;
          }
          if (local_c4 < local_bc) {
            if (iVar6 < local_c0) {
              local_c0 = iVar6;
            }
            local_c4 = local_c0;
          }
          local_c4 = local_c4 + *(int *)(in_RDI + (long)(iVar1 + 3) * 4) * -8;
          if (local_c4 < 0) {
            local_c4 = local_c4 + 7;
          }
          local_c8 = local_c4 >> 3;
          local_cc = iVar3;
          if (local_c8 < iVar3) {
            local_cc = local_c8;
          }
          if (-iVar3 < local_cc) {
            local_d0 = iVar3;
            if (local_c8 < iVar3) {
              local_d0 = local_c8;
            }
            local_d4 = local_d0;
          }
          else {
            local_d4 = -iVar3;
          }
          *(int *)(in_RDI + (long)(iVar1 + 3) * 4) =
               *(int *)(in_RDI + (long)(iVar1 + 3) * 4) + local_d4;
        }
        iVar1 = local_2c;
      }
    }
    for (local_1c = 2; local_1c < in_ESI + -2; local_1c = local_1c + 2) {
      local_2c = in_ECX * local_1c + 2;
      local_28 = local_2c + in_ECX;
      for (local_20 = 2; local_20 < in_EDX + -2; local_20 = local_20 + 2) {
        local_138 = *(int *)(in_RDI + (long)(local_2c + in_ECX * -2 + -2) * 4);
        local_120 = *(int *)(in_RDI + (long)(local_2c + iVar4 + -2) * 4);
        iVar1 = *(int *)(in_RDI + (long)(local_2c + in_ECX * -2 + 2) * 4);
        local_118 = *(int *)(in_RDI + (long)(local_2c + iVar4 + 2) * 4);
        local_130 = *(int *)(in_RDI + (long)local_2c * 4);
        iVar6 = ((local_118 + local_138) - iVar1) - local_120;
        iVar2 = *(int *)(in_RDI + (long)local_28 * 4);
        iVar7 = iVar2 * 2;
        iVar5 = *(int *)(in_RDI + (long)(local_2c + 1) * 4);
        local_134 = iVar5 * 2;
        if (local_118 - local_130 < 1) {
          local_d8 = 0;
        }
        else {
          local_d8 = local_118 - local_130;
        }
        if (local_130 - local_120 < 1) {
          local_e0 = 0;
        }
        else {
          local_e0 = local_130 - local_120;
        }
        if (local_d8 + iVar2 * -2 + iVar5 * -2 < local_e0 + iVar7 + iVar5 * -2) {
          if (local_118 - local_130 < 1) {
            local_e4 = 0;
          }
          else {
            local_e4 = local_118 - local_130;
          }
          local_e8 = local_e4 + iVar2 * -2 + iVar5 * -2;
        }
        else {
          if (local_130 - local_120 < 1) {
            local_ec = 0;
          }
          else {
            local_ec = local_130 - local_120;
          }
          local_e8 = local_ec + iVar7 + iVar5 * -2;
        }
        if (local_130 - iVar1 < 1) {
          local_f0 = 0;
        }
        else {
          local_f0 = local_130 - iVar1;
        }
        if (local_138 - local_130 < 1) {
          local_f8 = 0;
        }
        else {
          local_f8 = local_138 - local_130;
        }
        if (local_f0 + iVar2 * -2 + local_134 < local_f8 + iVar7 + local_134) {
          if (local_130 - iVar1 < 1) {
            local_fc = 0;
          }
          else {
            local_fc = local_130 - iVar1;
          }
          local_fc = local_fc + iVar2 * -2;
        }
        else {
          if (local_138 - local_130 < 1) {
            local_104 = 0;
          }
          else {
            local_104 = local_138 - local_130;
          }
          local_fc = local_104 + iVar7;
        }
        local_100 = local_fc + local_134;
        if (local_e8 < local_100) {
          local_108 = local_e8;
        }
        else {
          local_108 = local_100;
        }
        local_144 = local_108 << 4;
        if (local_118 - local_130 < 0) {
          local_10c = local_118 - local_130;
        }
        else {
          local_10c = 0;
        }
        if (local_130 - local_120 < 0) {
          local_114 = local_130 - local_120;
        }
        else {
          local_114 = 0;
        }
        if (local_114 + iVar7 + iVar5 * -2 < local_10c + iVar2 * -2 + iVar5 * -2) {
          if (local_118 - local_130 < 0) {
            local_118 = local_118 - local_130;
          }
          else {
            local_118 = 0;
          }
          local_11c = local_118 + iVar2 * -2 + iVar5 * -2;
        }
        else {
          if (local_130 - local_120 < 0) {
            local_120 = local_130 - local_120;
          }
          else {
            local_120 = 0;
          }
          local_11c = local_120 + iVar7 + iVar5 * -2;
        }
        if (local_130 - iVar1 < 0) {
          local_124 = local_130 - iVar1;
        }
        else {
          local_124 = 0;
        }
        if (local_138 - local_130 < 0) {
          local_12c = local_138 - local_130;
        }
        else {
          local_12c = 0;
        }
        if (local_12c + iVar7 + local_134 < local_124 + iVar2 * -2 + local_134) {
          if (local_130 - iVar1 < 0) {
            local_130 = local_130 - iVar1;
          }
          else {
            local_130 = 0;
          }
          local_130 = local_130 + iVar2 * -2;
        }
        else {
          if (local_138 - local_130 < 0) {
            local_138 = local_138 - local_130;
          }
          else {
            local_138 = 0;
          }
          local_130 = local_138 + iVar7;
        }
        local_134 = local_130 + local_134;
        if (local_134 < local_11c) {
          local_13c = local_11c;
        }
        else {
          local_13c = local_134;
        }
        local_148 = local_13c << 4;
        if (local_148 < local_144) {
          local_140 = local_144;
          if (iVar6 < local_144) {
            local_140 = iVar6;
          }
          if (local_148 < local_140) {
            if (iVar6 < local_144) {
              local_144 = iVar6;
            }
            local_148 = local_144;
          }
          local_148 = local_148 + *(int *)(in_RDI + (long)(local_28 + 1) * 4) * -0x40;
          if (local_148 < 0) {
            local_148 = local_148 + 0x3f;
          }
          local_14c = local_148 >> 6;
          local_150 = iVar3;
          if (local_14c < iVar3) {
            local_150 = local_14c;
          }
          if (-iVar3 < local_150) {
            local_154 = iVar3;
            if (local_14c < iVar3) {
              local_154 = local_14c;
            }
            local_158 = local_154;
          }
          else {
            local_158 = -iVar3;
          }
          *(int *)(in_RDI + (long)(local_28 + 1) * 4) =
               *(int *)(in_RDI + (long)(local_28 + 1) * 4) + local_158;
        }
        local_2c = local_2c + 2;
        local_28 = local_28 + 2;
      }
    }
  }
  return;
}

Assistant:

static void 
hsmooth(int a[], int nxtop, int nytop, int ny, int scale)
/*
int a[];			 array of H-transform coefficients		
int nxtop,nytop;	 size of coefficient block to use			
int ny;				 actual 1st dimension of array			
int scale;			 truncation scale factor that was used	
*/
{
int i, j;
int ny2, s10, s00, diff, dmax, dmin, s, smax;
int hm, h0, hp, hmm, hpm, hmp, hpp, hx2, hy2;
int m1,m2;

	/*
	 * Maximum change in coefficients is determined by scale factor.
	 * Since we rounded during division (see digitize.c), the biggest
	 * permitted change is scale/2.
	 */
	smax = (scale >> 1);
	if (smax <= 0) return;
	ny2 = ny << 1;
	/*
	 * We're indexing a as a 2-D array with dimensions (nxtop,ny) of which
	 * only (nxtop,nytop) are used.  The coefficients on the edge of the
	 * array are not adjusted (which is why the loops below start at 2
	 * instead of 0 and end at nxtop-2 instead of nxtop.)
	 */
	/*
	 * Adjust x difference hx
	 */
	for (i = 2; i<nxtop-2; i += 2) {
		s00 = ny*i;				/* s00 is index of a[i,j]	*/
		s10 = s00+ny;			/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<nytop; j += 2) {
			/*
			 * hp is h0 (mean value) in next x zone, hm is h0 in previous x zone
			 */
			hm = a[s00-ny2];
			h0 = a[s00];
			hp = a[s00+ny2];
			/*
			 * diff = 8 * hx slope that would match h0 in neighboring zones
			 */
			diff = hp-hm;
			/*
			 * monotonicity constraints on diff
			 */
			dmax = max( min( (hp-h0), (h0-hm) ), 0 ) << 2;
			dmin = min( max( (hp-h0), (h0-hm) ), 0 ) << 2;
			/*
			 * if monotonicity would set slope = 0 then don't change hx.
			 * note dmax>=0, dmin<=0.
			 */
			if (dmin < dmax) {
				diff = max( min(diff, dmax), dmin);
				/*
				 * Compute change in slope limited to range +/- smax.
				 * Careful with rounding negative numbers when using
				 * shift for divide by 8.
				 */
				s = diff-(a[s10]<<3);
				s = (s>=0) ? (s>>3) : ((s+7)>>3) ;
				s = max( min(s, smax), -smax);
				a[s10] = a[s10]+s;
			}
			s00 += 2;
			s10 += 2;
		}
	}
	/*
	 * Adjust y difference hy
	 */
	for (i = 0; i<nxtop; i += 2) {
		s00 = ny*i+2;
		s10 = s00+ny;
		for (j = 2; j<nytop-2; j += 2) {
			hm = a[s00-2];
			h0 = a[s00];
			hp = a[s00+2];
			diff = hp-hm;
			dmax = max( min( (hp-h0), (h0-hm) ), 0 ) << 2;
			dmin = min( max( (hp-h0), (h0-hm) ), 0 ) << 2;
			if (dmin < dmax) {
				diff = max( min(diff, dmax), dmin);
				s = diff-(a[s00+1]<<3);
				s = (s>=0) ? (s>>3) : ((s+7)>>3) ;
				s = max( min(s, smax), -smax);
				a[s00+1] = a[s00+1]+s;
			}
			s00 += 2;
			s10 += 2;
		}
	}
	/*
	 * Adjust curvature difference hc
	 */
	for (i = 2; i<nxtop-2; i += 2) {
		s00 = ny*i+2;
		s10 = s00+ny;
		for (j = 2; j<nytop-2; j += 2) {
			/*
			 * ------------------    y
			 * | hmp |    | hpp |    |
			 * ------------------    |
			 * |     | h0 |     |    |
			 * ------------------    -------x
			 * | hmm |    | hpm |
			 * ------------------
			 */
			hmm = a[s00-ny2-2];
			hpm = a[s00+ny2-2];
			hmp = a[s00-ny2+2];
			hpp = a[s00+ny2+2];
			h0  = a[s00];
			/*
			 * diff = 64 * hc value that would match h0 in neighboring zones
			 */
			diff = hpp + hmm - hmp - hpm;
			/*
			 * 2 times x,y slopes in this zone
			 */
			hx2 = a[s10  ]<<1;
			hy2 = a[s00+1]<<1;
			/*
			 * monotonicity constraints on diff
			 */
			m1 = min(max(hpp-h0,0)-hx2-hy2, max(h0-hpm,0)+hx2-hy2);
			m2 = min(max(h0-hmp,0)-hx2+hy2, max(hmm-h0,0)+hx2+hy2);
			dmax = min(m1,m2) << 4;
			m1 = max(min(hpp-h0,0)-hx2-hy2, min(h0-hpm,0)+hx2-hy2);
			m2 = max(min(h0-hmp,0)-hx2+hy2, min(hmm-h0,0)+hx2+hy2);
			dmin = max(m1,m2) << 4;
			/*
			 * if monotonicity would set slope = 0 then don't change hc.
			 * note dmax>=0, dmin<=0.
			 */
			if (dmin < dmax) {
				diff = max( min(diff, dmax), dmin);
				/*
				 * Compute change in slope limited to range +/- smax.
				 * Careful with rounding negative numbers when using
				 * shift for divide by 64.
				 */
				s = diff-(a[s10+1]<<6);
				s = (s>=0) ? (s>>6) : ((s+63)>>6) ;
				s = max( min(s, smax), -smax);
				a[s10+1] = a[s10+1]+s;
			}
			s00 += 2;
			s10 += 2;
		}
	}
}